

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O0

int arkLSSetMassPreconditioner
              (void *arkode_mem,ARKLsMassPrecSetupFn psetup,ARKLsMassPrecSolveFn psolve)

{
  int iVar1;
  code *P_data;
  SUNPSetupFn Pset;
  SUNLinearSolver_Ops in_RDX;
  void *in_RSI;
  int retval;
  SUNPSolveFn arkls_mpsolve;
  SUNPSetupFn arkls_mpsetup;
  ARKLsMassMem arkls_mem;
  ARKodeMem ark_mem;
  uint in_stack_ffffffffffffffb8;
  ARKLsMassMem *in_stack_ffffffffffffffc0;
  ARKodeMem *in_stack_ffffffffffffffc8;
  SUNLinearSolver in_stack_ffffffffffffffd0;
  ARKodeMem in_stack_ffffffffffffffd8;
  int local_4;
  
  local_4 = arkLs_AccessMassMem(in_stack_ffffffffffffffd8,(char *)in_stack_ffffffffffffffd0,
                                in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  if (local_4 == 0) {
    if (*(long *)(*(long *)((long)in_stack_ffffffffffffffd0[6].content + 8) + 0x18) == 0) {
      arkProcessError(in_stack_ffffffffffffffd8,-3,"ARKLS","arkLSSetMassPreconditioner",
                      "SUNLinearSolver object does not support user-supplied preconditioning");
      local_4 = -3;
    }
    else {
      in_stack_ffffffffffffffd0[7].content = in_RSI;
      in_stack_ffffffffffffffd0[7].ops = in_RDX;
      P_data = arkLsMPSetup;
      if (in_RSI == (void *)0x0) {
        P_data = (code *)0x0;
      }
      Pset = arkLsMPSolve;
      if (in_RDX == (SUNLinearSolver_Ops)0x0) {
        Pset = (SUNPSetupFn)0x0;
      }
      iVar1 = SUNLinSolSetPreconditioner
                        (in_stack_ffffffffffffffd0,P_data,Pset,
                         (SUNPSolveFn)(ulong)in_stack_ffffffffffffffb8);
      if (iVar1 == 0) {
        local_4 = 0;
      }
      else {
        arkProcessError(in_stack_ffffffffffffffd8,-0xc,"ARKLS","arkLSSetMassPreconditioner",
                        "Error in calling SUNLinSolSetPreconditioner");
        local_4 = -0xc;
      }
    }
  }
  return local_4;
}

Assistant:

int arkLSSetMassPreconditioner(void *arkode_mem,
                               ARKLsMassPrecSetupFn psetup,
                               ARKLsMassPrecSolveFn psolve)
{
  ARKodeMem    ark_mem;
  ARKLsMassMem arkls_mem;
  SUNPSetupFn     arkls_mpsetup;
  SUNPSolveFn     arkls_mpsolve;
  int          retval;

  /* access ARKLsMassMem structure */
  retval = arkLs_AccessMassMem(arkode_mem, "arkLSSetMassPreconditioner",
                               &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* issue error if LS object does not allow user-supplied preconditioning */
  if (arkls_mem->LS->ops->setpreconditioner == NULL) {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS",
                    "arkLSSetMassPreconditioner",
                    "SUNLinearSolver object does not support user-supplied preconditioning");
    return(ARKLS_ILL_INPUT);
  }

  /* store function pointers for user-supplied routines in ARKLs interface */
  arkls_mem->pset   = psetup;
  arkls_mem->psolve = psolve;

  /* notify linear solver to call ARKLs interface routines */
  arkls_mpsetup = (psetup == NULL) ? NULL : arkLsMPSetup;
  arkls_mpsolve = (psolve == NULL) ? NULL : arkLsMPSolve;
  retval = SUNLinSolSetPreconditioner(arkls_mem->LS, ark_mem,
                                      arkls_mpsetup, arkls_mpsolve);
  if (retval != SUNLS_SUCCESS) {
    arkProcessError(ark_mem, ARKLS_SUNLS_FAIL, "ARKLS",
                    "arkLSSetMassPreconditioner",
                    "Error in calling SUNLinSolSetPreconditioner");
    return(ARKLS_SUNLS_FAIL);
  }

  return(ARKLS_SUCCESS);
}